

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O2

void __thiscall
OpenMD::DynamicRectMatrix<double>::allocate(DynamicRectMatrix<double> *this,uint nrow,uint ncol)

{
  double **ppdVar1;
  double *pdVar2;
  uint i;
  ulong uVar3;
  
  this->nrow_ = nrow;
  this->ncol_ = ncol;
  ppdVar1 = (double **)operator_new__((ulong)nrow * 8);
  this->data_ = ppdVar1;
  for (uVar3 = 0; nrow != uVar3; uVar3 = uVar3 + 1) {
    pdVar2 = (double *)operator_new__((ulong)ncol << 3);
    this->data_[uVar3] = pdVar2;
  }
  return;
}

Assistant:

void allocate(unsigned int nrow, unsigned int ncol) {
      nrow_ = (unsigned int)nrow;
      ncol_ = (unsigned int)ncol;
      data_ = new Real*[nrow_];
      for (unsigned int i = 0; i < nrow_; ++i)
        data_[i] = new Real[ncol_];
    }